

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O2

uint16_t __thiscall icu_63::Normalizer2Impl::nextFCD16(Normalizer2Impl *this,UChar **s,UChar *limit)

{
  UChar UVar1;
  UChar *pUVar2;
  UBool UVar3;
  uint16_t uVar4;
  uint lead;
  
  pUVar2 = *s;
  *s = pUVar2 + 1;
  UVar1 = *pUVar2;
  lead = (uint)(ushort)UVar1;
  if ((ushort)this->minDecompNoCP <= (ushort)UVar1) {
    UVar3 = singleLeadMightHaveNonZeroFCD16(this,lead);
    if (UVar3 != '\0') {
      if ((((UVar1 & 0xfc00U) == 0xd800) && (pUVar2 = *s, pUVar2 != limit)) &&
         (((ushort)*pUVar2 & 0xfc00) == 0xdc00)) {
        lead = (uint)(ushort)UVar1 * 0x400 + (uint)(ushort)*pUVar2 + 0xfca02400;
        *s = pUVar2 + 1;
      }
      uVar4 = getFCD16FromNormData(this,lead);
      return uVar4;
    }
  }
  return 0;
}

Assistant:

uint16_t nextFCD16(const UChar *&s, const UChar *limit) const {
        UChar32 c=*s++;
        if(c<minDecompNoCP || !singleLeadMightHaveNonZeroFCD16(c)) {
            return 0;
        }
        UChar c2;
        if(U16_IS_LEAD(c) && s!=limit && U16_IS_TRAIL(c2=*s)) {
            c=U16_GET_SUPPLEMENTARY(c, c2);
            ++s;
        }
        return getFCD16FromNormData(c);
    }